

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CBoss.cpp
# Opt level: O3

void __thiscall CBoss::showInfo(CBoss *this)

{
  ostream *poVar1;
  char *local_38;
  long local_30;
  char local_28 [16];
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"id: ",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(this->super_CWorker)._id);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tname: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->super_CWorker)._name._M_dataplus._M_p,
                      (this->super_CWorker)._name._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tlevel:",7);
  (*(this->super_CWorker)._vptr_CWorker[1])(&local_38,this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,local_38,local_30);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\tduty:",6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"to manage the whole company",0x1b);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return;
}

Assistant:

void CBoss::showInfo()
{
    cout << "id: "     << this->_id
         << "\tname: " << this->_name
         << "\tlevel:" << this->getLevel()
         << "\tduty:"
         << "to manage the whole company"
         << endl;
}